

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O3

UBool __thiscall
icu_63::RuleBasedTimeZone::getNextTransition
          (RuleBasedTimeZone *this,UDate base,UBool inclusive,TimeZoneTransition *result)

{
  UBool UVar1;
  TimeZoneRule *toRule;
  TimeZoneRule *fromRule;
  UDate transitionTime;
  UErrorCode status;
  TimeZoneRule *local_40;
  TimeZoneRule *local_38;
  UDate local_30;
  UErrorCode local_24;
  
  local_24 = U_ZERO_ERROR;
  completeConst(this,&local_24);
  if ((local_24 < U_ILLEGAL_ARGUMENT_ERROR) &&
     (UVar1 = findNext(this,base,inclusive,&local_30,&local_38,&local_40), UVar1 != '\0')) {
    TimeZoneTransition::setTime(result,local_30);
    TimeZoneTransition::setFrom(result,local_38);
    TimeZoneTransition::setTo(result,local_40);
    return '\x01';
  }
  return '\0';
}

Assistant:

UBool
RuleBasedTimeZone::getNextTransition(UDate base, UBool inclusive, TimeZoneTransition& result) const {
    UErrorCode status = U_ZERO_ERROR;
    completeConst(status);
    if (U_FAILURE(status)) {
        return FALSE;
    }
    UDate transitionTime;
    TimeZoneRule *fromRule, *toRule;
    UBool found = findNext(base, inclusive, transitionTime, fromRule, toRule);
    if (found) {
        result.setTime(transitionTime);
        result.setFrom((const TimeZoneRule&)*fromRule);
        result.setTo((const TimeZoneRule&)*toRule);
        return TRUE;
    }
    return FALSE;
}